

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

int fy_emit_explicit_document_end(fy_emitter *emit)

{
  int ret;
  fy_emitter *emit_local;
  
  emit_local._4_4_ = fy_emit_common_explicit_document_end(emit);
  if (emit_local._4_4_ == 0) {
    emit->fyd = (fy_document *)0x0;
    emit_local._4_4_ = 0;
  }
  return emit_local._4_4_;
}

Assistant:

int fy_emit_explicit_document_end(struct fy_emitter *emit) {
    int ret;

    ret = fy_emit_common_explicit_document_end(emit);
    if (ret)
        return ret;

    emit->fyd = NULL;
    return 0;
}